

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_cigars.c
# Opt level: O0

unsigned_long binomial_coefficient(unsigned_long n,unsigned_long k)

{
  undefined8 local_30;
  unsigned_long d;
  unsigned_long r;
  unsigned_long k_local;
  unsigned_long n_local;
  
  d = 1;
  if (n < k) {
    n_local = 0;
  }
  else {
    k_local = n;
    for (local_30 = 1; local_30 <= k; local_30 = local_30 + 1) {
      d = (k_local * d) / local_30;
      k_local = k_local - 1;
    }
    n_local = d;
  }
  return n_local;
}

Assistant:

static inline unsigned long binomial_coefficient(
        unsigned long n,
        unsigned long k)
{
    /* from http://blog.plover.com/math/choose.html */
    unsigned long r = 1;
    unsigned long d;
    if (k > n) {
        return 0;
    }
    for (d = 1; d <= k; d++) {
        r *= n--;
        r /= d;
    }
    return r;
}